

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip-name.c
# Opt level: O1

int run_test_ip_name(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_1;
  char dst [46];
  TestAddr test_addr;
  uv_handle_t local_68;
  sockaddr_in6 local_24;
  
  iVar1 = uv_ip4_addr("192.168.0.1",0x23a3,(sockaddr_in *)&local_24);
  local_68._16_8_ = SEXT48(iVar1);
  local_68.data = (uv_loop_t *)0x0;
  if (local_68._16_8_ == 0) {
    iVar1 = uv_ip4_name((sockaddr_in *)&local_24,(char *)&local_68.type,0x10);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a43a0;
    iVar1 = strcmp("192.168.0.1",(char *)&local_68.type);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a43ad;
    iVar1 = uv_ip_name((sockaddr *)&local_24,(char *)&local_68.type,0x10);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a43ba;
    iVar1 = strcmp("192.168.0.1",(char *)&local_68.type);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a43c7;
    iVar1 = uv_ip6_addr("fe80::2acf:daff:fedd:342a",0x23a3,&local_24);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a43d4;
    iVar1 = uv_ip6_name(&local_24,(char *)&local_68.type,0x2e);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a43e1;
    iVar1 = strcmp("fe80::2acf:daff:fedd:342a",(char *)&local_68.type);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a43ee;
    iVar1 = uv_ip_name((sockaddr *)&local_24,(char *)&local_68.type,0x2e);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a43fb;
    iVar1 = strcmp("fe80::2acf:daff:fedd:342a",(char *)&local_68.type);
    local_68.data = (void *)(long)iVar1;
    local_68.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_68.data != (uv_loop_t *)0x0) goto LAB_001a4408;
    local_24.sin6_family = 1;
    local_68.data = (uv_loop_t *)0xffffffffffffff9f;
    iVar1 = uv_ip_name((sockaddr *)&local_24,(char *)&local_68.type,0x2e);
    local_68.loop = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)local_68.data == local_68.loop) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_68.data = (uv_loop_t *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      local_68.loop = (uv_loop_t *)(long)iVar1;
      if ((uv_loop_t *)local_68.data == local_68.loop) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001a4422;
    }
  }
  else {
    run_test_ip_name_cold_1();
LAB_001a43a0:
    run_test_ip_name_cold_2();
LAB_001a43ad:
    run_test_ip_name_cold_3();
LAB_001a43ba:
    run_test_ip_name_cold_4();
LAB_001a43c7:
    run_test_ip_name_cold_5();
LAB_001a43d4:
    run_test_ip_name_cold_6();
LAB_001a43e1:
    run_test_ip_name_cold_7();
LAB_001a43ee:
    run_test_ip_name_cold_8();
LAB_001a43fb:
    run_test_ip_name_cold_9();
LAB_001a4408:
    run_test_ip_name_cold_10();
  }
  run_test_ip_name_cold_11();
LAB_001a4422:
  handle = &local_68;
  run_test_ip_name_cold_12();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(ip_name) {
    char dst[INET6_ADDRSTRLEN];
    union TestAddr test_addr;
    struct sockaddr* addr = &test_addr.addr;
    struct sockaddr_in* addr4 = &test_addr.addr4;
    struct sockaddr_in6* addr6 = &test_addr.addr6;

    /* test ip4_name */
    ASSERT_OK(uv_ip4_addr("192.168.0.1", TEST_PORT, addr4));
    ASSERT_OK(uv_ip4_name(addr4, dst, INET_ADDRSTRLEN));
    ASSERT_OK(strcmp("192.168.0.1", dst));

    ASSERT_OK(uv_ip_name(addr, dst, INET_ADDRSTRLEN));
    ASSERT_OK(strcmp("192.168.0.1", dst));

    /* test ip6_name */
    ASSERT_OK(uv_ip6_addr("fe80::2acf:daff:fedd:342a", TEST_PORT, addr6));
    ASSERT_OK(uv_ip6_name(addr6, dst, INET6_ADDRSTRLEN));
    ASSERT_OK(strcmp("fe80::2acf:daff:fedd:342a", dst));

    ASSERT_OK(uv_ip_name(addr, dst, INET6_ADDRSTRLEN));
    ASSERT_OK(strcmp("fe80::2acf:daff:fedd:342a", dst));

    /* test other sa_family */
    addr->sa_family = AF_UNIX;
    /* size is not a concern here */
    ASSERT_EQ(UV_EAFNOSUPPORT, uv_ip_name(addr, dst, INET6_ADDRSTRLEN));

    MAKE_VALGRIND_HAPPY(uv_default_loop());
    return 0;
}